

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

size_t mime_mem_read(char *buffer,size_t size,size_t nitems,void *instream)

{
  undefined8 local_38;
  size_t sz;
  curl_mimepart *part;
  void *instream_local;
  size_t nitems_local;
  size_t size_local;
  char *buffer_local;
  
  local_38 = *(long *)((long)instream + 0x78) - *(long *)((long)instream + 0x98);
  if (nitems < local_38) {
    local_38 = nitems;
  }
  if (local_38 != 0) {
    memcpy(buffer,(void *)(*(long *)((long)instream + 0x20) + *(long *)((long)instream + 0x98)),
           local_38);
  }
  *(size_t *)((long)instream + 0x98) = local_38 + *(long *)((long)instream + 0x98);
  return local_38;
}

Assistant:

static size_t mime_mem_read(char *buffer, size_t size, size_t nitems,
                            void *instream)
{
  curl_mimepart *part = (curl_mimepart *) instream;
  size_t sz = (size_t) part->datasize - part->state.offset;
  (void) size;   /* Always 1.*/

  if(sz > nitems)
    sz = nitems;

  if(sz)
    memcpy(buffer, (char *) &part->data[part->state.offset], sz);

  part->state.offset += sz;
  return sz;
}